

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryShaderRenderTest::init
          (GeometryShaderRenderTest *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  bool bVar2;
  ContextType ctxType;
  ApiType requiredApiType;
  int depthBits;
  int extraout_EAX;
  RenderContext *pRVar3;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  Surface *pSVar4;
  int *piVar5;
  ReferenceContextBuffers *this_02;
  RenderTarget *pRVar6;
  PixelFormat *colorBits;
  ReferenceContext *this_03;
  GLContext *this_04;
  TestLog *log;
  Vector<int,_4> local_108;
  MultisamplePixelBufferAccess local_f8;
  MultisamplePixelBufferAccess local_d0;
  MultisamplePixelBufferAccess local_a8;
  undefined1 local_80 [8];
  ReferenceContextLimits limits;
  GeometryShaderRenderTest *this_local;
  
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports(ctxType,requiredApiType);
  if (!bVar2) {
    this_00 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
    bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_EXT_geometry_shader");
    if (!bVar2) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,"Tests require GL_EXT_geometry_shader extension or higher context version."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                 ,0x753);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  sglr::ReferenceContextLimits::ReferenceContextLimits((ReferenceContextLimits *)local_80);
  pSVar4 = (Surface *)operator_new(0x18);
  piVar5 = tcu::Vector<int,_2>::x(&this->m_viewportSize);
  iVar1 = *piVar5;
  piVar5 = tcu::Vector<int,_2>::y(&this->m_viewportSize);
  tcu::Surface::Surface(pSVar4,iVar1,*piVar5);
  this->m_glResult = pSVar4;
  pSVar4 = (Surface *)operator_new(0x18);
  piVar5 = tcu::Vector<int,_2>::x(&this->m_viewportSize);
  iVar1 = *piVar5;
  piVar5 = tcu::Vector<int,_2>::y(&this->m_viewportSize);
  tcu::Surface::Surface(pSVar4,iVar1,*piVar5);
  this->m_refResult = pSVar4;
  this_02 = (ReferenceContextBuffers *)operator_new(0x78);
  pRVar6 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  colorBits = tcu::RenderTarget::getPixelFormat(pRVar6);
  pRVar6 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  depthBits = tcu::RenderTarget::getDepthBits(pRVar6);
  piVar5 = tcu::Vector<int,_2>::x(&this->m_viewportSize);
  iVar1 = *piVar5;
  piVar5 = tcu::Vector<int,_2>::y(&this->m_viewportSize);
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            (this_02,colorBits,depthBits,0,iVar1,*piVar5,1);
  this->m_refBuffers = this_02;
  this_03 = (ReferenceContext *)operator_new(0x61b0);
  sglr::ReferenceContextBuffers::getColorbuffer(&local_a8,this->m_refBuffers);
  sglr::ReferenceContextBuffers::getDepthbuffer(&local_d0,this->m_refBuffers);
  sglr::ReferenceContextBuffers::getStencilbuffer(&local_f8,this->m_refBuffers);
  sglr::ReferenceContext::ReferenceContext
            (this_03,(ReferenceContextLimits *)local_80,&local_a8,&local_d0,&local_f8);
  this->m_refContext = this_03;
  this_04 = (GLContext *)operator_new(0x170);
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  piVar5 = tcu::Vector<int,_2>::x(&this->m_viewportSize);
  iVar1 = *piVar5;
  piVar5 = tcu::Vector<int,_2>::y(&this->m_viewportSize);
  tcu::Vector<int,_4>::Vector(&local_108,0,0,iVar1,*piVar5);
  sglr::GLContext::GLContext(this_04,pRVar3,log,3,&local_108);
  this->m_glContext = (Context *)this_04;
  sglr::ReferenceContextLimits::~ReferenceContextLimits((ReferenceContextLimits *)local_80);
  return extraout_EAX;
}

Assistant:

void GeometryShaderRenderTest::init (void)
{
	// requirements
	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
		TCU_THROW(NotSupportedError, "Tests require GL_EXT_geometry_shader extension or higher context version.");

	// gen resources
	{
		sglr::ReferenceContextLimits limits;

		m_glResult		= new tcu::Surface(m_viewportSize.x(), m_viewportSize.y());
		m_refResult		= new tcu::Surface(m_viewportSize.x(), m_viewportSize.y());

		m_refBuffers	= new sglr::ReferenceContextBuffers(m_context.getRenderTarget().getPixelFormat(), m_context.getRenderTarget().getDepthBits(), 0, m_viewportSize.x(), m_viewportSize.y());
		m_refContext	= new sglr::ReferenceContext(limits, m_refBuffers->getColorbuffer(), m_refBuffers->getDepthbuffer(), m_refBuffers->getStencilbuffer());
		m_glContext		= new sglr::GLContext(m_context.getRenderContext(), m_testCtx.getLog(), sglr::GLCONTEXT_LOG_CALLS | sglr::GLCONTEXT_LOG_PROGRAMS, tcu::IVec4(0, 0, m_viewportSize.x(), m_viewportSize.y()));
	}
}